

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

int lws_mqtt_fill_fixed_header
              (uint8_t *p,lws_mqtt_control_packet_t ctrl_pkt_type,uint8_t dup,
              lws_mqtt_qos_levels_t qos,uint8_t retain)

{
  byte bVar1;
  
  if (LMQCP_AUTH < ctrl_pkt_type) {
    return -1;
  }
  bVar1 = (char)ctrl_pkt_type << 4;
  if ((0xfab6U >> (ctrl_pkt_type & 0x1f) & 1) == 0) {
    if ((0x540U >> (ctrl_pkt_type & 0x1f) & 1) == 0) {
      if (ctrl_pkt_type != LMQCP_PUBLISH) {
        return -1;
      }
      if (QOS2 < qos) {
        _lws_log(1,"%s: Unsupport QoS level 0x%x\n","lws_mqtt_fill_fixed_header");
        return -1;
      }
      bVar1 = bVar1 | retain != '\0' | (char)qos * '\x02' | (dup != '\0') << 3;
    }
    else {
      bVar1 = bVar1 | 2;
    }
  }
  *p = bVar1;
  return 0;
}

Assistant:

int
lws_mqtt_fill_fixed_header(uint8_t *p, lws_mqtt_control_packet_t ctrl_pkt_type,
			   uint8_t dup, lws_mqtt_qos_levels_t qos,
			   uint8_t retain)
{
	lws_mqtt_fixed_hdr_t hdr;

	hdr.bits = 0;
	hdr.flags.ctrl_pkt_type = (uint8_t) ctrl_pkt_type;

	switch(ctrl_pkt_type) {
	case LMQCP_PUBLISH:
		hdr.flags.dup = !!dup;
		/*
		 * A PUBLISH Packet MUST NOT have both QoS bits set to
		 * 1. If a Server or Client receives a PUBLISH Packet
		 * which has both QoS bits set to 1 it MUST close the
		 * Network Connection [MQTT-3.3.1-4].
		 */
		if (qos >= RESERVED_QOS_LEVEL) {
			lwsl_err("%s: Unsupport QoS level 0x%x\n",
				 __func__, qos);
			return -1;
		}
		hdr.flags.qos = (uint8_t)qos;
		hdr.flags.retain = !!retain;
		break;

	case LMQCP_CTOS_CONNECT:
	case LMQCP_STOC_CONNACK:
	case LMQCP_PUBACK:
	case LMQCP_PUBREC:
	case LMQCP_PUBCOMP:
	case LMQCP_STOC_SUBACK:
	case LMQCP_STOC_UNSUBACK:
	case LMQCP_CTOS_PINGREQ:
	case LMQCP_STOC_PINGRESP:
	case LMQCP_DISCONNECT:
	case LMQCP_AUTH:
		hdr.bits &= 0xf0;
		break;

	/*
	 * Bits 3,2,1 and 0 of the fixed header of the PUBREL,
	 * SUBSCRIBE, UNSUBSCRIBE Control Packets are reserved and
	 * MUST be set to 0,0,1 and 0 respectively. The Server MUST
	 * treat any other value as malformed and close the Network
	 * Connection [MQTT-3.6.1-1], [MQTT-3.8.1-1], [MQTT-3.10.1-1].
	 */
	case LMQCP_PUBREL:
	case LMQCP_CTOS_SUBSCRIBE:
	case LMQCP_CTOS_UNSUBSCRIBE:
		hdr.bits |= 0x02;
		break;

	default:
		return -1;
	}

	*p = hdr.bits;

	return 0;
}